

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O3

bool __thiscall Unit::setNamesStandard(Unit *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ostream *poVar12;
  bool bVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  bool bVar17;
  bool bVar18;
  stringstream symbol;
  stringstream name;
  string local_370;
  undefined7 uStack_36f;
  long local_360 [2];
  uint local_350;
  int local_34c;
  uint local_348;
  uint local_344;
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (this->bInvalid == true) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->sUnitName,0,(char *)(this->sUnitName)._M_string_length,0x14d092);
    std::__cxx11::string::_M_replace
              ((ulong)&this->sUnitSymbol,0,(char *)(this->sUnitSymbol)._M_string_length,0x14d09f);
    return true;
  }
  std::__cxx11::stringstream::stringstream(local_340);
  std::__cxx11::stringstream::stringstream(local_1b8);
  switch(this->nExpPrefix) {
  case 0:
    pcVar16 = "";
    lVar15 = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"",0);
    break;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"da",2);
    lVar15 = 4;
    pcVar16 = "deca";
    break;
  case 2:
    local_370 = (string)0x68;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 5;
    pcVar16 = "hecto";
    break;
  case 3:
    local_370 = (string)0x6b;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 4;
    pcVar16 = "kilo";
    break;
  case 6:
    local_370 = (string)0x4d;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 4;
    pcVar16 = "mega";
    break;
  case 9:
    local_370 = (string)0x47;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 4;
    pcVar16 = "giga";
    break;
  case 0xc:
    local_370 = (string)0x54;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 4;
    pcVar16 = "tera";
    break;
  case 0xf:
    local_370 = (string)0x50;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 4;
    pcVar16 = "peta";
    break;
  case 0x12:
    local_370 = (string)0x45;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 3;
    pcVar16 = "exa";
    break;
  case 0x15:
    local_370 = (string)0x5a;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 5;
    pcVar16 = "zetta";
    break;
  case 0x18:
    local_370 = (string)0x59;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 5;
    pcVar16 = "yotta";
    break;
  case -0x18:
    local_370 = (string)0x79;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 5;
    pcVar16 = "yocto";
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"10^",3);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_330,this->nExpPrefix);
    local_370 = (string)0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_370,1);
    goto LAB_0013d5c6;
  case -0x15:
    local_370 = (string)0x7a;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 5;
    pcVar16 = "zepto";
    break;
  case -0x12:
    local_370 = (string)0x61;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 4;
    pcVar16 = "atto";
    break;
  case -0xf:
    local_370 = (string)0x66;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 5;
    pcVar16 = "femto";
    break;
  case -0xc:
    local_370 = (string)0x70;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 4;
    pcVar16 = "pico";
    break;
  case -9:
    local_370 = (string)0x6e;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 4;
    pcVar16 = "nano";
    break;
  case -6:
    local_370 = (string)0x75;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 5;
    pcVar16 = "micro";
    break;
  case -3:
    local_370 = (string)0x6d;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 5;
    pcVar16 = "milli";
    break;
  case -2:
    local_370 = (string)0x63;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 5;
    pcVar16 = "centi";
    break;
  case -1:
    local_370 = (string)0x64;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,(char *)&local_370,1);
    lVar15 = 4;
    pcVar16 = "deci";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar16,lVar15);
LAB_0013d5c6:
  uVar1 = this->siUnits[0];
  uVar2 = this->siUnits[1];
  bVar13 = uVar1 == 0;
  bVar11 = uVar2 == 0;
  uVar3 = this->siUnits[2];
  iVar4 = this->siUnits[3];
  iVar5 = this->siUnits[4];
  iVar6 = this->siUnits[5];
  iVar7 = this->siUnits[6];
  if ((((((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && iVar4 == 0) && iVar5 == 0) && iVar6 == 0) &&
      iVar7 == 0) {
    pcVar16 = "";
    lVar15 = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"",0);
  }
  else {
    local_34c = CONCAT31(local_34c._1_3_,
                         ((((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && iVar4 == 0) && iVar5 == 0)
                         && iVar6 == 0);
    local_344 = uVar2 | uVar3;
    if ((((uVar1 ^ 1) == 0 && local_344 == 0) && ((iVar4 == 0 && iVar5 == 0) && iVar6 == 0)) &&
        iVar7 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"m",1);
      lVar15 = 5;
      pcVar16 = "meter";
    }
    else {
      local_350 = uVar2 ^ 1;
      bVar10 = local_350 == 0;
      local_348 = uVar1;
      if (((((uVar3 == 0 && iVar4 == 0) && iVar5 == 0) && (uVar1 == 0 && local_350 == 0)) &&
          iVar6 == 0) && iVar7 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"kg",2);
        lVar15 = 8;
        pcVar16 = "kilogram";
      }
      else if ((((iVar4 == 0 && iVar5 == 0) && iVar6 == 0) && (uVar3 == 1 && (bVar13 && bVar11))) &&
               iVar7 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"s",1);
        lVar15 = 6;
        pcVar16 = "second";
      }
      else if ((((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) &&
               ((iVar4 == 1 && iVar5 == 0) && iVar6 == 0)) && iVar7 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"A",1);
        lVar15 = 6;
        pcVar16 = "ampere";
      }
      else if ((((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && iVar4 == 0) &&
               ((iVar5 == 1 && iVar6 == 0) && iVar7 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"K",1);
        lVar15 = 6;
        pcVar16 = "kelvin";
      }
      else if (((((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && iVar4 == 0) && iVar5 == 0) &&
               (iVar6 == 1 && iVar7 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"mol",3);
        lVar15 = 4;
        pcVar16 = "mole";
      }
      else if ((((((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && iVar4 == 0) && iVar5 == 0) &&
               iVar6 == 0) && iVar7 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"cd",2);
        lVar15 = 7;
        pcVar16 = "candela";
      }
      else if (((((uVar1 ^ 1) == 0 && local_350 == 0) && ((uVar3 ^ 0xfffffffe) == 0 && iVar4 == 0))
               && (iVar5 == 0 && iVar6 == 0)) && iVar7 == 0) {
        local_370 = (string)0x4e;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,(char *)&local_370,1);
        lVar15 = 6;
        pcVar16 = "newton";
      }
      else if ((((uVar1 == 0xffffffff && local_350 == 0) &&
                ((uVar3 ^ 0xfffffffe) == 0 && iVar4 == 0)) && (iVar5 == 0 && iVar6 == 0)) &&
               iVar7 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Pa",2);
        lVar15 = 6;
        pcVar16 = "pascal";
      }
      else {
        bVar17 = uVar3 == 0xfffffffe;
        bVar8 = uVar1 == 2;
        bVar9 = local_350 == 0;
        local_350 = CONCAT31((int3)(uVar2 >> 8),bVar17 && (bVar8 && bVar9));
        local_34c = iVar6;
        if ((((iVar4 == 0 && iVar5 == 0) && iVar6 == 0) && (bVar17 && (bVar8 && bVar9))) &&
            iVar7 == 0) {
          local_370 = (string)0x4a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,(char *)&local_370,1);
          lVar15 = 5;
          pcVar16 = "joule";
        }
        else {
          bVar18 = uVar3 == 0xfffffffd;
          if ((((iVar4 == 0 && iVar5 == 0) && iVar6 == 0) && ((bVar8 && bVar9) && bVar18)) &&
              iVar7 == 0) {
            local_370 = (string)0x57;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_330,(char *)&local_370,1);
            lVar15 = 4;
            pcVar16 = "watt";
          }
          else if (((uVar3 == 1 && (bVar13 && bVar11)) && ((iVar5 == 0 && iVar4 == 1) && iVar6 == 0)
                   ) && iVar7 == 0) {
            local_370 = (string)0x43;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_330,(char *)&local_370,1);
            lVar15 = 7;
            pcVar16 = "coulomb";
          }
          else if ((((iVar4 == -1 && iVar5 == 0) && iVar6 == 0) && ((bVar8 && bVar9) && bVar18)) &&
                   iVar7 == 0) {
            local_370 = (string)0x56;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_330,(char *)&local_370,1);
            lVar15 = 4;
            pcVar16 = "volt";
          }
          else {
            uVar14 = uVar1 ^ 0xfffffffe;
            if (((iVar5 == 0 && iVar6 == 0) && iVar7 == 0) &&
                ((iVar4 == 2 && uVar3 == 4) && (uVar2 == 0xffffffff && uVar14 == 0))) {
              local_370 = (string)0x46;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_330,(char *)&local_370,1);
              lVar15 = 5;
              pcVar16 = "farad";
            }
            else if ((((bVar8 && bVar9) && bVar18) && ((iVar4 == -2 && iVar5 == 0) && iVar6 == 0))
                     && iVar7 == 0) {
              local_370 = (string)0x4f;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_330,(char *)&local_370,1);
              lVar15 = 3;
              pcVar16 = "ohm";
            }
            else if (((iVar5 == 0 && iVar6 == 0) && iVar7 == 0) &&
                     ((uVar2 == 0xffffffff && uVar14 == 0) && (uVar3 == 3 && iVar4 == 2))) {
              local_370 = (string)0x53;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_330,(char *)&local_370,1);
              lVar15 = 7;
              pcVar16 = "siemens";
            }
            else if (((bVar17 && (bVar8 && bVar9)) && ((iVar5 == 0 && iVar4 == -1) && iVar6 == 0))
                     && iVar7 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Wb",2);
              lVar15 = 5;
              pcVar16 = "weber";
            }
            else if ((iVar6 == 0 && iVar7 == 0) &&
                     ((uVar1 == 0 && bVar10) && ((uVar3 == 0xfffffffe && iVar4 == -1) && iVar5 == 0)
                     )) {
              local_370 = (string)0x54;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_330,(char *)&local_370,1);
              lVar15 = 5;
              pcVar16 = "tesla";
            }
            else if (((uVar14 == 0 && local_344 == 0) && ((iVar4 == 0 && iVar5 == 0) && iVar6 == 0))
                     && iVar7 == 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"lx",2);
              lVar15 = 3;
              pcVar16 = "lux";
            }
            else if ((iVar7 == 0 && iVar6 == 1) &&
                     (((bVar13 && bVar11) && (uVar3 == 0xffffffff && iVar4 == 0)) && iVar5 == 0)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"kat",3);
              lVar15 = 5;
              pcVar16 = "katal";
            }
            else {
              if ((((!bVar13 || !bVar11) || (uVar3 != 0xffffffff || iVar4 != 0)) || iVar5 != 0) ||
                  (iVar6 != 0 || iVar7 != 0)) {
                bVar13 = false;
                goto LAB_0013dd28;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"Hz",2);
              lVar15 = 5;
              pcVar16 = "Hertz";
            }
          }
        }
      }
    }
  }
  bVar13 = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar16,lVar15);
LAB_0013dd28:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->sUnitName,&local_370);
  if ((long *)CONCAT71(uStack_36f,local_370) != local_360) {
    operator_delete((long *)CONCAT71(uStack_36f,local_370),local_360[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->sUnitSymbol,&local_370);
  if ((long *)CONCAT71(uStack_36f,local_370) != local_360) {
    operator_delete((long *)CONCAT71(uStack_36f,local_370),local_360[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  return bVar13;
}

Assistant:

bool Unit::setNamesStandard()
{
	bool match = false;
	
	if (bInvalid) {
		sUnitName = "unit unvalid";
		sUnitSymbol = "uv";
		return true;
	}
	
	stringstream symbol;
	stringstream name;
	
	// the prefix
	switch(nExpPrefix) {
		case -24:
			symbol << 'y'; name << "yocto"; break;
		case -21:
			symbol << 'z'; name << "zepto"; break;
		case -18:
			symbol << 'a'; name << "atto"; break;
		case -15:
			symbol << 'f'; name << "femto"; break;
		case -12:
			symbol << 'p'; name << "pico"; break;
		case -9:
			symbol << 'n'; name << "nano"; break;
		case -6:
			symbol << 'u'; name << "micro"; break;
		case -3:
			symbol << 'm'; name << "milli"; break;
		case -2:
			symbol << 'c'; name << "centi"; break;
		case -1:
			symbol << 'd'; name << "deci"; break;
		case 1:
			symbol << "da"; name << "deca"; break;
		case 0:
			symbol << ""; name << ""; break;
		case 2:
			symbol << 'h'; name << "hecto"; break;
		case 3:
			symbol << 'k'; name << "kilo"; break;
		case 6:
			symbol << 'M'; name << "mega"; break;
		case 9:
			symbol << 'G'; name << "giga"; break;
		case 12:
			symbol << 'T'; name << "tera"; break;
		case 15:
			symbol << 'P'; name << "peta"; break;
		case 18:
			symbol << 'E'; name << "exa"; break;
		case 21:
			symbol << 'Z'; name << "zetta"; break;
		case 24:
			symbol << 'Y'; name << "yotta"; break;
		default:
			symbol << "10^" << nExpPrefix << ' '; break;
	}
/*	sUnitName = name.str();
	sUnitSymbol = symbol.str();
	name.clear();
	symbol.clear();
*/	
	// the basics
	if (equals(0,0,0,0,0,0,0)) {
		symbol << "";
		name << ""; // was "no unit"
		match = true;
	} else if (equals(1,0,0,0,0,0,0)) {
		symbol << "m";
		name << "meter";
		match = true;
	} else if (equals(0,1,0,0,0,0,0)) {
		symbol << "kg";
		name << "kilogram";
		match = true;
	} else if (equals(0,0,1,0,0,0,0)) {
		symbol << "s";
		name << "second";
		match = true;
	} else if (equals(0,0,0,1,0,0,0)) {
		symbol << "A";
		name << "ampere";
		match = true;
	} else if (equals(0,0,0,0,1,0,0)) { 
		symbol << "K";
		name << "kelvin";
		match = true;
	} else if (equals(0,0,0,0,0,1,0)) {
		symbol << "mol";
		name << "mole";
		match = true;
	} else if (equals(0,0,0,0,0,0,1)) {
		symbol << "cd";
		name << "candela";
		match = true;
	}
	
	// special
	else if (equals(1,1,-2,0,0,0,0)) {
		symbol << 'N';
		name << "newton";
		match = true;
	} else if (equals(-1,1,-2,0,0,0,0)) {
		symbol << "Pa";
		name << "pascal";
		match = true;
	} else if (equals(2,1,-2,0,0,0,0)) {
		symbol << 'J';
		name << "joule";
		match = true;
	} else if (equals(2,1,-3,0,0,0,0)) {
		symbol << 'W';
		name << "watt";
		match = true;
	} else if (equals(0,0,1,1,0,0,0)) {
		symbol << 'C';
		name << "coulomb";
		match = true;
	} else if (equals(2,1,-3,-1,0,0,0)) {
		symbol << 'V';
		name << "volt";
		match = true;
	} else if (equals(-2,-1,4,2,0,0,0)) {
		symbol << 'F';
		name << "farad";
		match = true;
	} else if (equals(2,1,-3,-2,0,0,0)) {
		symbol << 'O'; // should we do something like \Omega?
		name << "ohm";
		match = true;
	} else if (equals(-2,-1,3,2,0,0,0)) {
		symbol << 'S';
		name << "siemens";
		match = true;
	} else if (equals(2,1,-2,-1,0,0,0)) {
		symbol << "Wb";
		name << "weber";
		match = true;
	} else if (equals(0,1,-2,-1,0,0,0)) {
		symbol << 'T';
		name << "tesla";
		match = true;
	} else if (equals(2,1,-2,-1,0,0,0)) {
		symbol << 'H';
		name << "henry";
		match = true;
	} else if (equals(-2,0,0,0,0,0,1)) {
		symbol << "lx";
		name << "lux";
		match = true;
	} else if (equals(0,0,-1,0,0,1,0)) {
		symbol << "kat";
		name << "katal";
		match = true;
	} else if (equals(0,0,-1,0,0,0,0)) {
		symbol << "Hz";
		name << "Hertz";
		match = true;
	}
	
	sUnitName = name.str();
	sUnitSymbol = symbol.str();
	return match;
}